

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

Parse_ast * __thiscall
lambda::parse_from::helper::parse_term(Parse_ast *__return_storage_ptr__,helper *this)

{
  optional<lambda::Parse_ast> tm;
  optional<lambda::Parse_ast> local_50;
  
  maybe_parse_term(&local_50,this);
  if (local_50.super__Optional_base<lambda::Parse_ast,_false,_false>._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged == true) {
    std::__detail::__variant::
    _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)&local_50);
    if (local_50.super__Optional_base<lambda::Parse_ast,_false,_false>._M_payload.
        super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
        super__Optional_payload_base<lambda::Parse_ast>._M_engaged == true) {
      local_50.super__Optional_base<lambda::Parse_ast,_false,_false>._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged = false;
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)&local_50);
    }
    return __return_storage_ptr__;
  }
  unexpected_thing(this);
}

Assistant:

Parse_ast parse_term() {
      if (auto tm = maybe_parse_term()) {
        return std::move(*tm);
      } else {
        unexpected_thing();
      }
    }